

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
argument_loader<anurbs::BrepFaceField<5l>*,long,Eigen::Matrix<double,1,5,1,1,5>const&>::
load_impl_sequence<0ul,1ul,2ul>
          (argument_loader<anurbs::BrepFaceField<5l>*,long,Eigen::Matrix<double,1,5,1,1,5>const&>
           *this,initializer_list<bool> *call)

{
  bool bVar1;
  type_caster_generic *this_00;
  reference pvVar2;
  __tuple_element_t<1UL,_tuple<type_caster<BrepFaceField<5L>,_void>,_type_caster<long,_void>,_type_caster<Matrix<double,_1,_5,_1,_1,_5>,_void>_>_>
  *this_01;
  __tuple_element_t<2UL,_tuple<type_caster<BrepFaceField<5L>,_void>,_type_caster<long,_void>,_type_caster<Matrix<double,_1,_5,_1,_1,_5>,_void>_>_>
  *this_02;
  const_iterator pbVar3;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  handle local_78;
  reference local_70;
  handle local_60;
  reference local_58;
  handle local_48;
  bool local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  initializer_list<bool> local_38;
  initializer_list<bool> *local_28;
  initializer_list<bool> *__range3;
  function_call *call_local;
  argument_loader<anurbs::BrepFaceField<5L>_*,_long,_const_Eigen::Matrix<double,_1,_5,_1,_1,_5>_&>
  *this_local;
  
  __range3 = call;
  call_local = (function_call *)this;
  this_00 = (type_caster_generic *)
            std::
            get<0ul,pybind11::detail::type_caster<anurbs::BrepFaceField<5l>,void>,pybind11::detail::type_caster<long,void>,pybind11::detail::type_caster<Eigen::Matrix<double,1,5,1,1,5>,void>>
                      ((tuple<pybind11::detail::type_caster<anurbs::BrepFaceField<5L>,_void>,_pybind11::detail::type_caster<long,_void>,_pybind11::detail::type_caster<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_void>_>
                        *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,0);
  local_48.m_ptr = pvVar2->m_ptr;
  local_58 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),0);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_58);
  local_3b = type_caster_generic::load(this_00,local_48,bVar1);
  this_01 = std::
            get<1ul,pybind11::detail::type_caster<anurbs::BrepFaceField<5l>,void>,pybind11::detail::type_caster<long,void>,pybind11::detail::type_caster<Eigen::Matrix<double,1,5,1,1,5>,void>>
                      ((tuple<pybind11::detail::type_caster<anurbs::BrepFaceField<5L>,_void>,_pybind11::detail::type_caster<long,_void>,_pybind11::detail::type_caster<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_void>_>
                        *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,1);
  local_60.m_ptr = pvVar2->m_ptr;
  local_70 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),1);
  bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_70);
  local_3a = type_caster<long,_void>::load(this_01,local_60,bVar1);
  this_02 = std::
            get<2ul,pybind11::detail::type_caster<anurbs::BrepFaceField<5l>,void>,pybind11::detail::type_caster<long,void>,pybind11::detail::type_caster<Eigen::Matrix<double,1,5,1,1,5>,void>>
                      ((tuple<pybind11::detail::type_caster<anurbs::BrepFaceField<5L>,_void>,_pybind11::detail::type_caster<long,_void>,_pybind11::detail::type_caster<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_void>_>
                        *)this);
  pvVar2 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)
                      &__range3->_M_len,2);
  local_78.m_ptr = pvVar2->m_ptr;
  ___begin0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)(__range3 + 2),2);
  bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&__begin0);
  local_39 = type_caster<Eigen::Matrix<double,_1,_5,_1,_1,_5>,_void>::load(this_02,local_78,bVar1);
  local_38._M_array = &local_3b;
  local_38._M_len = 3;
  local_28 = &local_38;
  __end0 = std::initializer_list<bool>::begin(local_28);
  pbVar3 = std::initializer_list<bool>::end(local_28);
  while( true ) {
    if (__end0 == pbVar3) {
      return true;
    }
    if ((*__end0 & 1U) == 0) break;
    __end0 = __end0 + 1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
        return true;
    }